

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O3

void __thiscall
llvm::
StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
::~StringMap(StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
             *this)

{
  StringMapEntryBase *__ptr;
  ulong uVar1;
  ulong uVar2;
  
  if (((this->super_StringMapImpl).NumItems != 0) &&
     (uVar2 = (ulong)(this->super_StringMapImpl).NumBuckets, uVar2 != 0)) {
    uVar1 = 0;
    do {
      __ptr = (this->super_StringMapImpl).TheTable[uVar1];
      if ((__ptr != (StringMapEntryBase *)0xfffffffffffffff8) &&
         (__ptr != (StringMapEntryBase *)0x0)) {
        if ((long *)__ptr[1].StrLen != (long *)0x0) {
          (**(code **)(*(long *)__ptr[1].StrLen + 0x10))();
        }
        free(__ptr);
      }
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  free((this->super_StringMapImpl).TheTable);
  return;
}

Assistant:

~StringMap() {
    // Delete all the elements in the map, but don't reset the elements
    // to default values.  This is a copy of clear(), but avoids unnecessary
    // work not required in the destructor.
    if (!empty()) {
      for (unsigned I = 0, E = NumBuckets; I != E; ++I) {
        StringMapEntryBase *Bucket = TheTable[I];
        if (Bucket && Bucket != getTombstoneVal()) {
          static_cast<MapEntryTy*>(Bucket)->Destroy(Allocator);
        }
      }
    }
    free(TheTable);
  }